

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall sznet::net::TcpServer::~TcpServer(TcpServer *this)

{
  bool bVar1;
  LogLevel LVar2;
  LogStream *this_00;
  self *psVar3;
  element_type *this_01;
  EventLoop *this_02;
  SourceFile file;
  code *local_1070;
  undefined8 local_1068;
  type local_1060;
  Functor local_1040;
  undefined1 local_1020 [8];
  TcpConnectionPtr conn;
  pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_> *item;
  iterator __end2;
  iterator __begin2;
  ConnectionMap *__range2;
  undefined4 local_fe8;
  Logger local_fe0;
  TcpServer *local_10;
  TcpServer *this_local;
  
  local_10 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 1) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)&__range2,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)__range2;
    file.m_size = local_fe8;
    Logger::Logger(&local_fe0,file,0x22,TRACE,"~TcpServer");
    this_00 = Logger::stream(&local_fe0);
    psVar3 = LogStream::operator<<(this_00,"TcpServer::~TcpServer [");
    psVar3 = LogStream::operator<<(psVar3,&this->m_name);
    LogStream::operator<<(psVar3,"] destructing");
    Logger::~Logger(&local_fe0);
  }
  __end2 = std::
           map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
           ::begin(&this->m_connections);
  item = (pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_> *)
         std::
         map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
         ::end(&this->m_connections);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&item);
    if (!bVar1) break;
    conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>
           ::operator*(&__end2);
    std::shared_ptr<sznet::net::TcpConnection>::shared_ptr
              ((shared_ptr<sznet::net::TcpConnection> *)local_1020,
               &((reference)
                conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->second);
    std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
               &(conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count);
    this_01 = std::
              __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_1020);
    this_02 = TcpConnection::getLoop(this_01);
    local_1070 = TcpConnection::connectDestroyed;
    local_1068 = 0;
    std::bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>&>
              (&local_1060,(offset_in_TcpConnection_to_subr *)&local_1070,
               (shared_ptr<sznet::net::TcpConnection> *)local_1020);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
              ((function<void()> *)&local_1040,&local_1060);
    EventLoop::runInLoop(this_02,&local_1040);
    std::function<void_()>::~function(&local_1040);
    std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
    ~_Bind(&local_1060);
    std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::TcpConnection> *)local_1020);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>::
    operator++(&__end2);
  }
  std::
  map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  ::~map(&this->m_connections);
  std::function<void_(sznet::net::EventLoop_*)>::~function(&this->m_threadInitCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
            (&this->m_writeCompleteCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::~function(&this->m_messageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function
            (&this->m_connectionCallback);
  std::shared_ptr<sznet::net::EventLoopThreadPool>::~shared_ptr(&this->m_threadPool);
  std::unique_ptr<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>::~unique_ptr
            (&this->m_acceptor);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__cxx11::string::~string((string *)&this->m_ipPort);
  return;
}

Assistant:

TcpServer::~TcpServer()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "TcpServer::~TcpServer [" << m_name << "] destructing";

	for (auto& item : m_connections)
	{
		TcpConnectionPtr conn(item.second);
		item.second.reset();
		conn->getLoop()->runInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
	}
}